

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O1

vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
* __thiscall
libtorrent::aux::read_endpoint_list<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
          (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           *__return_storage_ptr__,aux *this,bdecode_node *n)

{
  pointer pbVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  char **in_00;
  char **in_01;
  int i;
  iterator __position;
  bool bVar5;
  char *in;
  bdecode_node e;
  char *local_98;
  data_union local_8c;
  bdecode_node local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar3 = bdecode_node::type((bdecode_node *)this);
  if (tVar3 == list_t) {
    bVar5 = false;
    for (i = 0; iVar4 = bdecode_node::list_size((bdecode_node *)this), i < iVar4; i = i + 1) {
      bdecode_node::list_at(&local_70,(bdecode_node *)this,i);
      tVar3 = bdecode_node::type(&local_70);
      if (tVar3 == string_t) {
        iVar4 = bdecode_node::string_length(&local_70);
        bVar2 = false;
        if (5 < iVar4) {
          local_98 = bdecode_node::string_ptr(&local_70);
          iVar4 = bdecode_node::string_length(&local_70);
          if (iVar4 == 6) {
            read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                      ((basic_endpoint<boost::asio::ip::udp> *)&local_8c.base,(aux *)&local_98,in_00
                      );
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
              ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                        ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                          *)__return_storage_ptr__,__position,
                         (basic_endpoint<boost::asio::ip::udp> *)&local_8c.base);
            }
            else {
LAB_003b62ec:
              *(ulong *)((long)&((__position._M_current)->impl_).data_ + 0xc) =
                   CONCAT44(local_8c._16_4_,local_8c._12_4_);
              *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0x14) =
                   local_8c._20_8_;
              *(undefined8 *)&((__position._M_current)->impl_).data_ = local_8c._0_8_;
              *(ulong *)((long)&((__position._M_current)->impl_).data_ + 8) =
                   CONCAT44(local_8c._12_4_,local_8c._8_4_);
              (__return_storage_ptr__->
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          else {
            iVar4 = bdecode_node::string_length(&local_70);
            if (iVar4 == 0x12) {
              read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                        ((basic_endpoint<boost::asio::ip::udp> *)&local_8c.base,(aux *)&local_98,
                         in_01);
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (__return_storage_ptr__->
                  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_003b62ec;
              ::std::
              vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
              ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                        ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                          *)__return_storage_ptr__,__position,
                         (basic_endpoint<boost::asio::ip::udp> *)&local_8c.base);
            }
          }
          bVar2 = false;
        }
      }
      else {
        bVar2 = true;
        bVar5 = true;
      }
      if (local_70.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar2) {
        if (bVar5) {
          return __return_storage_ptr__;
        }
        pbVar1 = (__return_storage_ptr__->
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar1 == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(pbVar1,(long)(__return_storage_ptr__->
                                     super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pbVar1);
        return __return_storage_ptr__;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EndpointType> read_endpoint_list(libtorrent::bdecode_node const& n)
	{
		std::vector<EndpointType> ret;
		if (n.type() != bdecode_node::list_t) return ret;
		for (int i = 0; i < n.list_size(); ++i)
		{
			bdecode_node e = n.list_at(i);
			if (e.type() != bdecode_node::string_t) return ret;
			if (e.string_length() < 6) continue;
			char const* in = e.string_ptr();
			if (e.string_length() == 6)
				ret.push_back(read_v4_endpoint<EndpointType>(in));
			else if (e.string_length() == 18)
				ret.push_back(read_v6_endpoint<EndpointType>(in));
		}
		return ret;
	}